

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TAPReporter::assertionEnded(TAPReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  ostream *poVar2;
  Code colour;
  char *pcVar3;
  StringRef passOrFail;
  StringRef passOrFail_00;
  StringRef passOrFail_01;
  StringRef passOrFail_02;
  StringRef issue;
  StringRef passOrFail_03;
  StringRef passOrFail_04;
  StringRef issue_00;
  StringRef passOrFail_05;
  StringRef issue_01;
  StringRef passOrFail_06;
  StringRef issue_02;
  StringRef passOrFail_07;
  StringRef issue_03;
  size_type sStack_60;
  TapAssertionPrinter local_50;
  
  this->counter = this->counter + 1;
  poVar2 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,"# ");
  poVar2 = std::operator<<(poVar2,(string *)(this->super_StreamingReporterBase).currentTestCaseInfo)
  ;
  std::operator<<(poVar2,'\n');
  local_50.counter = this->counter;
  local_50.stream = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  local_50.colourImpl = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  local_50.messages = &_assertionStats->infoMessages;
  local_50.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50.printInfoMessages = true;
  OVar1 = (_assertionStats->assertionResult).m_resultData.resultType;
  local_50.result = &_assertionStats->assertionResult;
  switch(OVar1) {
  case Ok:
    passOrFail.m_size = 2;
    passOrFail.m_start = "ok";
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_50,passOrFail);
    anon_unknown_26::TapAssertionPrinter::printOriginalExpression(&local_50);
    anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(&local_50);
    if ((_assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) goto LAB_0014a962;
    break;
  case Info:
    pcVar3 = "info";
    sStack_60 = 4;
    goto LAB_0014a83f;
  case Warning:
    pcVar3 = "warning";
    sStack_60 = 7;
LAB_0014a83f:
    passOrFail_03.m_size = sStack_60;
    passOrFail_03.m_start = pcVar3;
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_50,passOrFail_03);
LAB_0014a848:
    anon_unknown_26::TapAssertionPrinter::printMessage(&local_50);
LAB_0014a90a:
    colour = FileName;
    goto LAB_0014a96a;
  case Warning|Info:
  case ExplicitSkip|Info:
  case ExplicitSkip|Warning:
  case ExplicitSkip|Warning|Info:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    goto switchD_0014a752_caseD_3;
  case ExplicitSkip:
    passOrFail_02.m_size = 2;
    passOrFail_02.m_start = "ok";
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_50,passOrFail_02);
    issue.m_size = 7;
    issue.m_start = " # SKIP";
    anon_unknown_26::TapAssertionPrinter::printIssue(&local_50,issue);
    goto LAB_0014a848;
  case ExpressionFailed:
    if (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0) {
      pcVar3 = "not ok";
      sStack_60 = 6;
    }
    else {
      pcVar3 = "ok";
      sStack_60 = 2;
    }
    passOrFail_07.m_size = sStack_60;
    passOrFail_07.m_start = pcVar3;
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_50,passOrFail_07);
    anon_unknown_26::TapAssertionPrinter::printOriginalExpression(&local_50);
    anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(&local_50);
    if ((((_assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok) ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) {
      issue_03.m_size = 7;
      issue_03.m_start = " # TODO";
      anon_unknown_26::TapAssertionPrinter::printIssue(&local_50,issue_03);
    }
LAB_0014a962:
    colour = FileName;
    goto LAB_0014a96a;
  case ExplicitFailure:
    passOrFail_04.m_size = 6;
    passOrFail_04.m_start = "not ok";
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_50,passOrFail_04);
    issue_00.m_size = 10;
    issue_00.m_start = "explicitly";
    anon_unknown_26::TapAssertionPrinter::printIssue(&local_50,issue_00);
    break;
  case Unknown:
  case FailureBit:
switchD_0014a752_caseD_ffffffff:
    passOrFail_01.m_size = 0x14;
    passOrFail_01.m_start = "** internal error **";
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_50,passOrFail_01);
    goto switchD_0014a752_caseD_3;
  default:
    if (OVar1 == Exception) goto switchD_0014a752_caseD_ffffffff;
    if (OVar1 == ThrewException) {
      passOrFail_05.m_size = 6;
      passOrFail_05.m_start = "not ok";
      anon_unknown_26::TapAssertionPrinter::printResultType(&local_50,passOrFail_05);
      pcVar3 = "unexpected exception with message:";
      sStack_60 = 0x22;
LAB_0014a8c6:
      issue_01.m_size = sStack_60;
      issue_01.m_start = pcVar3;
      anon_unknown_26::TapAssertionPrinter::printIssue(&local_50,issue_01);
      anon_unknown_26::TapAssertionPrinter::printMessage(&local_50);
    }
    else {
      if (OVar1 != DidntThrowException) {
        if (OVar1 != FatalErrorCondition) goto switchD_0014a752_caseD_3;
        passOrFail_00.m_size = 6;
        passOrFail_00.m_start = "not ok";
        anon_unknown_26::TapAssertionPrinter::printResultType(&local_50,passOrFail_00);
        pcVar3 = "fatal error condition with message:";
        sStack_60 = 0x23;
        goto LAB_0014a8c6;
      }
      passOrFail_06.m_size = 6;
      passOrFail_06.m_start = "not ok";
      anon_unknown_26::TapAssertionPrinter::printResultType(&local_50,passOrFail_06);
      issue_02.m_size = 0x1c;
      issue_02.m_start = "expected exception, got none";
      anon_unknown_26::TapAssertionPrinter::printIssue(&local_50,issue_02);
    }
    anon_unknown_26::TapAssertionPrinter::printExpressionWas(&local_50);
    goto LAB_0014a90a;
  }
  colour = None;
LAB_0014a96a:
  anon_unknown_26::TapAssertionPrinter::printRemainingMessages(&local_50,colour);
switchD_0014a752_caseD_3:
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  std::ostream::flush();
  return;
}

Assistant:

void TAPReporter::assertionEnded(AssertionStats const& _assertionStats) {
        ++counter;

        m_stream << "# " << currentTestCaseInfo->name << '\n';
        TapAssertionPrinter printer(m_stream, _assertionStats, counter, m_colour.get());
        printer.print();

        m_stream << '\n' << std::flush;
    }